

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processConfig.cpp
# Opt level: O0

double stringToDouble(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *words,size_t pos,string *lineID)

{
  size_type sVar1;
  int *piVar2;
  char *__nptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  size_type in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  double d;
  char *end;
  char *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  string *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  string local_1c8 [39];
  undefined1 local_1a1 [40];
  undefined1 local_179 [40];
  allocator local_151;
  string local_150 [32];
  double local_130;
  char *local_128;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [40];
  size_type local_10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (sVar1 < local_10 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Utils::adios_iotest",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"processConfig",&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"stringToDouble",&local_99);
    std::operator+((char *)in_stack_fffffffffffffe08,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffdf8);
    std::operator+(in_stack_fffffffffffffdf8,in_RDX);
    adios2::helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
               in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  piVar2 = __errno_location();
  *piVar2 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_8,local_10);
  __nptr = (char *)std::__cxx11::string::c_str();
  local_130 = strtod(__nptr,&local_128);
  if ((*local_128 == '\0') && (piVar2 = __errno_location(), *piVar2 != 0x22)) {
    return local_130;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"Utils::adios_iotest",&local_151);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_179;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_179 + 1),"processConfig",(allocator *)__lhs);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1a1 + 1),"stringToDouble",(allocator *)__rhs);
  std::operator+((char *)in_stack_fffffffffffffe08,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  std::operator+(__lhs,(char *)__rhs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_8,local_10);
  std::operator+(__lhs,__rhs);
  adios2::helper::Throw<std::invalid_argument>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf8);
  std::__cxx11::string::~string((string *)(local_1a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1a1);
  std::__cxx11::string::~string((string *)(local_179 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_179);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  return local_130;
}

Assistant:

double stringToDouble(std::vector<std::string> &words, size_t pos, std::string lineID)
{
    if (words.size() < pos + 1)
    {
        adios2::helper::Throw<std::invalid_argument>(
            "Utils::adios_iotest", "processConfig", "stringToDouble",
            "Line for " + lineID + " is invalid. Missing floating point value at word position " +
                std::to_string(pos + 1));
    }

    char *end;
    errno = 0;
    double d = static_cast<double>(std::strtod(words[pos].c_str(), &end));
    if (end[0] || errno == ERANGE)
    {
        adios2::helper::Throw<std::invalid_argument>(
            "Utils::adios_iotest", "processConfig", "stringToDouble",
            "Invalid floating point value given for " + lineID + ": " + words[pos]);
    }
    return d;
}